

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_privkey.cpp
# Opt level: O3

void __thiscall Privkey_HasWif_hex_Test::TestBody(Privkey_HasWif_hex_Test *this)

{
  bool bVar1;
  char *in_R9;
  bool is_compressed;
  AssertionResult gtest_ar_;
  NetType net_type;
  string hex;
  bool local_79;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_78;
  AssertHelper local_70;
  internal local_68 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_60;
  string local_58;
  NetType local_34;
  string local_30;
  
  local_30._M_dataplus._M_p = (pointer)&local_30.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_30,"305e293b010d29bf3c888b617763a438fee9054c8cab66eb12ad078f819d9f27",
             "");
  local_34 = kRegtest;
  local_79 = false;
  bVar1 = cfd::core::Privkey::HasWif(&local_30,&local_34,&local_79);
  local_68[0] = (internal)!bVar1;
  local_60.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (bVar1) {
    testing::Message::Message((Message *)&local_78);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_58,local_68,(AssertionResult *)"has_wif","true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_privkey.cpp"
               ,0xde,local_58._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_78);
    testing::internal::AssertHelper::~AssertHelper(&local_70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
    }
    if (local_78.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_78.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_78.ptr_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_60,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_68[0] = (internal)(local_79 ^ 1);
  local_60.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_79 != false) {
    testing::Message::Message((Message *)&local_78);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_58,local_68,(AssertionResult *)"is_compressed","true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_privkey.cpp"
               ,0xdf,local_58._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_78);
    testing::internal::AssertHelper::~AssertHelper(&local_70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
    }
    if (local_78.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_78.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_78.ptr_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_60,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

TEST(Privkey, HasWif_compressed) {
  std::string wif = "cQNmd1D8MqzijUuXHb2yS5oRSm2F3TSTTMvcHC3V7CiKxArpg1bg";
  NetType net_type = NetType::kRegtest;
  bool is_compressed = false;
  bool has_wif = Privkey::HasWif(wif, &net_type, &is_compressed);
  EXPECT_TRUE(has_wif);
  EXPECT_TRUE(is_compressed);
  EXPECT_EQ(NetType::kTestnet, net_type);
}